

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O0

_Bool parse_color(element_t *element,int id,color_t *color,_Bool inherit)

{
  _Bool _Var1;
  char *end_00;
  char *end;
  char *it;
  string_t *value;
  color_t *pcStack_28;
  _Bool inherit_local;
  color_t *color_local;
  element_t *peStack_18;
  int id_local;
  element_t *element_local;
  
  value._7_1_ = inherit;
  pcStack_28 = color;
  color_local._4_4_ = id;
  peStack_18 = element;
  it = (char *)find_attribute(element,id,inherit);
  if ((string_t *)it == (string_t *)0x0) {
    element_local._7_1_ = false;
  }
  else {
    end = ((string_t *)it)->data;
    end_00 = end + ((string_t *)it)->length;
    _Var1 = parse_color_value(&end,end_00,pcStack_28);
    if (_Var1) {
      element_local._7_1_ = end == end_00;
    }
    else {
      element_local._7_1_ = false;
    }
  }
  return element_local._7_1_;
}

Assistant:

static bool parse_color(const element_t* element, int id, color_t* color, bool inherit)
{
    const string_t* value = find_attribute(element, id, inherit);
    if(value == NULL)
        return false;
    const char* it = value->data;
    const char* end = it + value->length;
    if(parse_color_value(&it, end, color))
        return it == end;
    return false;
}